

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O3

void __thiscall Highs::deleteRowsInterface(Highs *this,HighsIndexCollection *index_collection)

{
  vector<double,_std::allocator<double>_> *scale;
  uint entry_dim;
  int iVar1;
  pointer piVar2;
  undefined8 in_RAX;
  HighsInt row;
  ulong uVar3;
  HighsInt new_row;
  uint uVar4;
  uint uVar5;
  bool deleted_nonbasic;
  bool deleted_basic;
  bool local_22;
  bool local_21;
  
  local_22 = SUB81((ulong)in_RAX >> 0x30,0);
  HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
  entry_dim = (this->model_).lp_.num_row_;
  HighsLp::deleteRows(&(this->model_).lp_,index_collection);
  if ((this->model_).lp_.num_row_ == entry_dim) {
    return;
  }
  this->model_status_ = kMin;
  if ((this->basis_).useful == true) {
    deleteBasisEntries(&(this->basis_).row_status,&local_21,&local_22,index_collection,entry_dim);
    if (local_22 == true) {
      (this->basis_).valid = false;
    }
  }
  if ((this->model_).lp_.scale_.has_scaling == true) {
    scale = &(this->model_).lp_.scale_.row;
    deleteScale(scale,index_collection);
    std::vector<double,_std::allocator<double>_>::resize(scale,(long)(this->model_).lp_.num_row_);
    (this->model_).lp_.scale_.num_row = (this->model_).lp_.num_row_;
  }
  invalidateModelStatusSolutionAndInfo(this);
  HEkk::deleteRows(&this->ekk_instance_,index_collection);
  if ((0 < (int)entry_dim & index_collection->is_mask_) == 1) {
    piVar2 = (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = 0;
    uVar4 = 0;
    do {
      iVar1 = piVar2[uVar3];
      uVar5 = -(uint)(iVar1 != 0) | uVar4;
      uVar4 = uVar4 + (iVar1 == 0);
      piVar2[uVar3] = uVar5;
      uVar3 = uVar3 + 1;
    } while (entry_dim != uVar3);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)&(this->model_).lp_.row_hash_);
  return;
}

Assistant:

void Highs::deleteRowsInterface(HighsIndexCollection& index_collection) {
  HighsLp& lp = model_.lp_;
  HighsBasis& basis = basis_;
  lp.ensureColwise();
  // Keep a copy of the original number of rows to check whether
  // any rows have been removed, and if there is mask to be updated
  HighsInt original_num_row = lp.num_row_;

  lp.deleteRows(index_collection);
  // Bail out if no rows were actually deleted
  if (lp.num_row_ == original_num_row) return;

  assert(lp.num_row_ < original_num_row);

  // Nontrivial deletion so reset the model_status and update any
  // Highs basis
  model_status_ = HighsModelStatus::kNotset;
  if (basis_.useful) {
    assert(basis_.row_status.size() == static_cast<size_t>(original_num_row));
    // Have a full set of row basis status values, so maintain them,
    // and only invalidate the basis if a nonbasic row has been
    // deleted
    deleteBasisRows(basis_, index_collection, original_num_row);
  } else {
    assert(!basis.valid);
  }

  if (lp.scale_.has_scaling) {
    deleteScale(lp.scale_.row, index_collection);
    lp.scale_.row.resize(lp.num_row_);
    lp.scale_.num_row = lp.num_row_;
  }
  // Deduce the consequences of deleting rows
  invalidateModelStatusSolutionAndInfo();

  // Determine any implications for simplex data
  ekk_instance_.deleteRows(index_collection);
  if (index_collection.is_mask_) {
    HighsInt new_row = 0;
    for (HighsInt row = 0; row < original_num_row; row++) {
      if (!index_collection.mask_[row]) {
        index_collection.mask_[row] = new_row;
        new_row++;
      } else {
        index_collection.mask_[row] = -1;
      }
    }
    assert(new_row == lp.num_row_);
  }
  assert(lpDimensionsOk("deleteRows", lp, options_.log_options));
  lp.row_hash_.name2index.clear();
}